

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idamax.c
# Opt level: O3

integer idamax_(integer *n,doublereal *dx,integer *incx)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  integer iVar4;
  ulong uVar5;
  double *pdVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  uVar2 = *n;
  iVar4 = 0;
  if (0 < (int)uVar2) {
    uVar3 = *incx;
    if (0 < (int)uVar3) {
      uVar5 = 1;
      iVar4 = 1;
      if (uVar2 != 1) {
        if (uVar3 == 1) {
          dVar11 = *dx;
          uVar9 = -(ulong)(dVar11 < -dVar11);
          dVar11 = (double)(~uVar9 & (ulong)dVar11 | (ulong)-dVar11 & uVar9);
          uVar9 = 2;
          do {
            dVar1 = dx[uVar9 - 1];
            uVar10 = -(ulong)(-dVar1 <= dVar1);
            dVar1 = (double)(~uVar10 & (ulong)-dVar1 | (ulong)dVar1 & uVar10);
            if (dVar11 < dVar1) {
              uVar5 = uVar9 & 0xffffffff;
            }
            iVar4 = (integer)uVar5;
            dVar11 = (double)(~-(ulong)(dVar11 < dVar1) & (ulong)dVar11 |
                             -(ulong)(dVar11 < dVar1) & (ulong)dVar1);
            uVar9 = uVar9 + 1;
          } while ((ulong)uVar2 + 1 != uVar9);
        }
        else {
          dVar11 = *dx;
          uVar9 = -(ulong)(dVar11 < -dVar11);
          dVar11 = (double)(~uVar9 & (ulong)dVar11 | (ulong)-dVar11 & uVar9);
          pdVar6 = dx + uVar3;
          uVar7 = 2;
          do {
            dVar1 = *pdVar6;
            uVar9 = -(ulong)(-dVar1 <= dVar1);
            dVar1 = (double)(~uVar9 & (ulong)-dVar1 | (ulong)dVar1 & uVar9);
            if (dVar11 < dVar1) {
              uVar5 = (ulong)uVar7;
            }
            iVar4 = (integer)uVar5;
            dVar11 = (double)(~-(ulong)(dVar11 < dVar1) & (ulong)dVar11 |
                             -(ulong)(dVar11 < dVar1) & (ulong)dVar1);
            pdVar6 = pdVar6 + uVar3;
            bVar8 = uVar7 != uVar2;
            uVar7 = uVar7 + 1;
          } while (bVar8);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

integer idamax_(integer *n, doublereal *dx, integer *incx)
{


    /* System generated locals */
integer ret_val, i__1;
    doublereal d__1;

    /* Local variables */
    doublereal dmax__;
    integer i, ix;


/*     finds the index of element having max. absolute value.   
       jack dongarra, linpack, 3/11/78.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DX(I) dx[(I)-1]


    ret_val = 0;
    if (*n < 1 || *incx <= 0) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    ix = 1;
    dmax__ = abs(DX(1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = DX(ix), abs(d__1)) <= dmax__) {
	    goto L5;
	}
	ret_val = i;
	dmax__ = (d__1 = DX(ix), abs(d__1));
L5:
	ix += *incx;
/* L10: */
    }
    return ret_val;

/*        code for increment equal to 1 */

L20:
    dmax__ = abs(DX(1));
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = DX(i), abs(d__1)) <= dmax__) {
	    goto L30;
	}
	ret_val = i;
	dmax__ = (d__1 = DX(i), abs(d__1));
L30:
	;
    }
    return ret_val;
}